

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O1

code_point nowide::utf::utf_traits<char,1>::decode<char_const*>(char **p,char *e)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  uchar c;
  code_point cVar5;
  uchar c_1;
  uint uVar6;
  
  pbVar2 = (byte *)*p;
  if (pbVar2 == (byte *)e) {
    return 0xfffffffe;
  }
  *p = (char *)(pbVar2 + 1);
  bVar1 = *pbVar2;
  uVar4 = 0;
  cVar5 = 0xffffffff;
  if (((char)bVar1 < '\0') && (uVar4 = 0xffffffff, 0xc1 < bVar1)) {
    if (bVar1 < 0xe0) {
      uVar4 = 1;
    }
    else if (bVar1 < 0xf0) {
      uVar4 = 2;
    }
    else {
      uVar4 = (bVar1 < 0xf5) - 1 | 3;
    }
  }
  if ((-1 < (int)uVar4) && (cVar5 = (code_point)bVar1, uVar4 != 0)) {
    uVar6 = ~(-1 << (6U - (char)uVar4 & 0x1f)) & cVar5;
    if (uVar4 == 1) {
      if (*p == e) {
        return 0xfffffffe;
      }
      *p = *p + 1;
    }
    else if (uVar4 == 2) {
      if (*p == e) {
        return 0xfffffffe;
      }
      *p = *p + 1;
    }
    else if (uVar4 == 3) {
      if (pbVar2 + 1 == (byte *)e) {
        return 0xfffffffe;
      }
      *p = (char *)(pbVar2 + 2);
    }
    else if (uVar6 < 0x110000) {
      if (uVar6 < 0x80) {
        iVar3 = 1;
      }
      else if (uVar6 < 0x800) {
        iVar3 = 2;
      }
      else {
        iVar3 = 4 - (uint)(uVar6 < 0x10000);
      }
      if (iVar3 != uVar4 + 1) {
        return 0xffffffff;
      }
      return uVar6;
    }
    cVar5 = 0xffffffff;
  }
  return cVar5;
}

Assistant:

static code_point decode(Iterator &p,Iterator e)
        {
            if(NOWIDE_UNLIKELY(p==e))
                return incomplete;

            unsigned char lead = *p++;

            // First byte is fully validated here
            int trail_size = trail_length(lead);

            if(NOWIDE_UNLIKELY(trail_size < 0))
                return illegal;

            //
            // Ok as only ASCII may be of size = 0
            // also optimize for ASCII text
            //
            if(trail_size == 0)
                return lead;
            
            code_point c = lead & ((1<<(6-trail_size))-1);

            // Read the rest
            unsigned char tmp;
            switch(trail_size) {
            case 3:
                if(NOWIDE_UNLIKELY(p==e))
                    return incomplete;
                tmp = *p++;
                if (!is_trail(tmp))
                    return illegal;
                c = (c << 6) | ( tmp & 0x3F);
            case 2:
                if(NOWIDE_UNLIKELY(p==e))
                    return incomplete;
                tmp = *p++;
                if (!is_trail(tmp))
                    return illegal;
                c = (c << 6) | ( tmp & 0x3F);
            case 1:
                if(NOWIDE_UNLIKELY(p==e))
                    return incomplete;
                tmp = *p++;
                if (!is_trail(tmp))
                    return illegal;
                c = (c << 6) | ( tmp & 0x3F);
            }

            // Check code point validity: no surrogates and
            // valid range
            if(NOWIDE_UNLIKELY(!is_valid_codepoint(c)))
                return illegal;

            // make sure it is the most compact representation
            if(NOWIDE_UNLIKELY(width(c)!=trail_size + 1))
                return illegal;

            return c;

        }